

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

bool anon_unknown.dwarf_5c5a51::EncodeECPrivateKey
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EC_KEY *key)

{
  int iVar1;
  uint enc_flags;
  bool bVar2;
  uint8_t *der;
  size_t der_len;
  ScopedCBB cbb;
  uint8_t *local_58;
  size_t local_50;
  CBB local_48;
  
  CBB_zero(&local_48);
  iVar1 = CBB_init(&local_48,0);
  if (iVar1 != 0) {
    enc_flags = EC_KEY_get_enc_flags((EC_KEY *)key);
    iVar1 = EC_KEY_marshal_private_key(&local_48,key,enc_flags);
    if (iVar1 != 0) {
      iVar1 = CBB_finish(&local_48,&local_58,&local_50);
      if (iVar1 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,local_58,
                   local_58 + local_50);
        bVar2 = true;
        OPENSSL_free(local_58);
        goto LAB_002cce8d;
      }
    }
  }
  bVar2 = false;
LAB_002cce8d:
  CBB_cleanup(&local_48);
  return bVar2;
}

Assistant:

static bool EncodeECPrivateKey(std::vector<uint8_t> *out, const EC_KEY *key) {
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !EC_KEY_marshal_private_key(cbb.get(), key, EC_KEY_get_enc_flags(key)) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  out->assign(der, der + der_len);
  OPENSSL_free(der);
  return true;
}